

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::DescriptorProto::ByteSizeLong(DescriptorProto *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Type *pTVar6;
  size_t sVar7;
  Type *this_00;
  Type *this_01;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  Type *pTVar8;
  size_t sVar9;
  uint uVar10;
  int n;
  long lVar11;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar7 = 0;
  }
  else {
    sVar7 = internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar5 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = sVar7 + uVar5;
  if ((ulong)uVar5 != 0) {
    uVar10 = 0;
    do {
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->field_).super_RepeatedPtrFieldBase,uVar10);
      sVar7 = FieldDescriptorProto::ByteSizeLong(pTVar6);
      uVar4 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + (ulong)uVar5;
  if ((ulong)uVar5 != 0) {
    uVar10 = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&(this->nested_type_).super_RepeatedPtrFieldBase,uVar10);
      sVar7 = ByteSizeLong(this_00);
      uVar4 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + (ulong)uVar5;
  if ((ulong)uVar5 != 0) {
    uVar10 = 0;
    do {
      this_01 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                          (&(this->enum_type_).super_RepeatedPtrFieldBase,uVar10);
      sVar7 = EnumDescriptorProto::ByteSizeLong(this_01);
      uVar4 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + (ulong)uVar5;
  if ((ulong)uVar5 != 0) {
    uVar10 = 0;
    do {
      this_02 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                          (&(this->extension_range_).super_RepeatedPtrFieldBase,uVar10);
      sVar7 = DescriptorProto_ExtensionRange::ByteSizeLong(this_02);
      uVar4 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + (ulong)uVar5;
  if ((ulong)uVar5 != 0) {
    uVar10 = 0;
    do {
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->extension_).super_RepeatedPtrFieldBase,uVar10);
      sVar7 = FieldDescriptorProto::ByteSizeLong(pTVar6);
      uVar4 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + (ulong)uVar5;
  if ((ulong)uVar5 != 0) {
    uVar10 = 0;
    do {
      this_03 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                          (&(this->oneof_decl_).super_RepeatedPtrFieldBase,uVar10);
      sVar7 = OneofDescriptorProto::ByteSizeLong(this_03);
      uVar4 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + (ulong)uVar5;
  if ((ulong)uVar5 != 0) {
    uVar10 = 0;
    do {
      this_04 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                          (&(this->reserved_range_).super_RepeatedPtrFieldBase,uVar10);
      sVar7 = DescriptorProto_ReservedRange::ByteSizeLong(this_04);
      uVar4 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  sVar7 = lVar11 + (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->reserved_name_).super_RepeatedPtrFieldBase,uVar10);
      uVar4 = (uint)pTVar8->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + pTVar8->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 3) != 0) {
    if ((uVar5 & 1) != 0) {
      sVar2 = ((this->name_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar9 = MessageOptions::ByteSizeLong(this->options_);
      uVar5 = (uint)sVar9 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + sVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
  }
  this->_cached_size_ = (int)sVar7;
  return sVar7;
}

Assistant:

size_t DescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  {
    unsigned int count = this->field_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->field(i));
    }
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  {
    unsigned int count = this->nested_type_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->nested_type(i));
    }
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  {
    unsigned int count = this->enum_type_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->enum_type(i));
    }
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  {
    unsigned int count = this->extension_range_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->extension_range(i));
    }
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  {
    unsigned int count = this->extension_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->extension(i));
    }
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  {
    unsigned int count = this->oneof_decl_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->oneof_decl(i));
    }
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  {
    unsigned int count = this->reserved_range_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->reserved_range(i));
    }
  }

  // repeated string reserved_name = 10;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->reserved_name_size());
  for (int i = 0, n = this->reserved_name_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->reserved_name(i));
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.MessageOptions options = 7;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}